

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper_p.h
# Opt level: O0

uint qt_gradient_clamp(QGradientData *data,int ipos)

{
  int local_1c;
  int local_18;
  int local_14;
  int limit;
  int ipos_local;
  QGradientData *data_local;
  
  ipos_local = ipos;
  if ((ipos < 0) || (0x3ff < ipos)) {
    if (data->spread == RepeatSpread) {
      local_14 = ipos % 0x400;
      if (local_14 < 0) {
        local_14 = local_14 + 0x400;
      }
      ipos_local = local_14;
    }
    else if (data->spread == ReflectSpread) {
      local_18 = ipos % 0x800;
      if (local_18 < 0) {
        local_18 = local_18 + 0x800;
      }
      if (local_18 < 0x400) {
        local_1c = local_18;
      }
      else {
        local_1c = 0x7ff - local_18;
      }
      ipos_local = local_1c;
    }
    else if (ipos < 0) {
      ipos_local = 0;
    }
    else if (0x3ff < ipos) {
      ipos_local = 0x3ff;
    }
  }
  return ipos_local;
}

Assistant:

static inline uint qt_gradient_clamp(const QGradientData *data, int ipos)
{
    if (ipos < 0 || ipos >= GRADIENT_STOPTABLE_SIZE) {
        if (data->spread == QGradient::RepeatSpread) {
            ipos = ipos % GRADIENT_STOPTABLE_SIZE;
            ipos = ipos < 0 ? GRADIENT_STOPTABLE_SIZE + ipos : ipos;
        } else if (data->spread == QGradient::ReflectSpread) {
            const int limit = GRADIENT_STOPTABLE_SIZE * 2;
            ipos = ipos % limit;
            ipos = ipos < 0 ? limit + ipos : ipos;
            ipos = ipos >= GRADIENT_STOPTABLE_SIZE ? limit - 1 - ipos : ipos;
        } else {
            if (ipos < 0)
                ipos = 0;
            else if (ipos >= GRADIENT_STOPTABLE_SIZE)
                ipos = GRADIENT_STOPTABLE_SIZE-1;
        }
    }

    Q_ASSERT(ipos >= 0);
    Q_ASSERT(ipos < GRADIENT_STOPTABLE_SIZE);

    return ipos;
}